

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_a_scalar
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  int iVar1;
  int iVar2;
  GLint GVar3;
  reference pvVar4;
  int local_3c;
  GLuint attribute_offset;
  GLint attribute;
  GLint group_offset;
  GLuint vertex_offset;
  GLint attribute_index;
  GLint n_attributes;
  vector<double,_std::allocator<double>_> *out_buffer_data_local;
  GLuint vertex_local;
  GLint n_type_local;
  attributeConfiguration *configuration_local;
  LimitTest *this_local;
  
  iVar1 = configuration->m_n_attributes_per_group;
  iVar2 = configuration->m_vertex_length;
  GVar3 = calculateAttributeGroupOffset(this,configuration,n_type);
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (out_buffer_data,(ulong)(local_3c + GVar3 + vertex * iVar2));
    *pvVar4 = (double)(local_3c + iVar1 * n_type + vertex * 2);
  }
  return;
}

Assistant:

void LimitTest::setAttributes_a_scalar(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
									   std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Double attributes should be assigned the value:
	 (n_attribute + gl_VertexID * 2) */

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = attribute + group_offset;

		out_buffer_data[attribute_offset] = attribute + attribute_index + vertex * 2;
	}
}